

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O0

void re2c::genSetState(OutputFile *o,uint32_t ind,uint32_t fillIndex)

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  string local_58;
  string local_38;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t fillIndex_local;
  uint32_t ind_local;
  OutputFile *o_local;
  
  local_18 = fillIndex;
  local_14 = ind;
  _fillIndex_local = o;
  pOVar1 = OutputFile::wind(o,ind);
  poVar2 = Opt::operator->((Opt *)&opts);
  std::__cxx11::string::string((string *)&local_58,(string *)&poVar2->state_set);
  poVar2 = Opt::operator->((Opt *)&opts);
  replaceParam<unsigned_int>(&local_38,&local_58,&poVar2->state_set_arg,&local_18);
  OutputFile::wstring(pOVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  poVar2 = Opt::operator->((Opt *)&opts);
  if ((poVar2->state_set_naked & 1U) == 0) {
    pOVar1 = OutputFile::ws(_fillIndex_local,"(");
    pOVar1 = OutputFile::wu32(pOVar1,local_18);
    OutputFile::ws(pOVar1,");");
  }
  OutputFile::ws(_fillIndex_local,"\n");
  return;
}

Assistant:

void genSetState(OutputFile & o, uint32_t ind, uint32_t fillIndex)
{
	o.wind(ind).wstring(replaceParam (opts->state_set, opts->state_set_arg, fillIndex));
	if (!opts->state_set_naked)
	{
		o.ws("(").wu32(fillIndex).ws(");");
	}
	o.ws("\n");
}